

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::FastErR1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  char cVar1;
  byte bVar2;
  undefined8 uVar3;
  uint uVar4;
  RepeatedField<int> *this;
  ulong uVar5;
  uint *puVar6;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 data_00;
  ulong uVar7;
  int value;
  char *pcVar8;
  ushort *puVar9;
  
  if (data.field_0._0_1_ != '\0') {
    pcVar8 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar8;
  }
  data_00 = data.field_0;
  this = RefAt<google::protobuf::RepeatedField<int>>(msg,(ulong)data.field_0 >> 0x30);
  cVar1 = *ptr;
  uVar3 = *(undefined8 *)
           ((long)&table->has_bits_offset +
           ((ulong)data.field_0 >> 0x18 & 0xff) * 8 + (ulong)table->aux_offset);
  do {
    pcVar8 = (char *)(long)*(char *)((long)ptr + 1);
    if ((long)pcVar8 < 0) {
      uVar5 = (long)(char)*(ushort *)((long)ptr + 2) << 7 | 0x7f;
      if ((long)uVar5 < 0) {
        data_00.data = (long)*(char *)((long)ptr + 3) << 0xe | 0x3fff;
        if ((long)data_00 < 0) {
          uVar5 = uVar5 & ((long)(char)*(ushort *)((long)ptr + 4) << 0x15 | 0x1fffffU);
          if ((long)uVar5 < 0) {
            data_00.data = data_00.data & ((long)*(char *)((long)ptr + 5) << 0x1c | 0xfffffffU);
            if ((long)data_00.data < 0) {
              uVar5 = uVar5 & ((long)(char)*(ushort *)((long)ptr + 6) << 0x23 | 0x7ffffffffU);
              if ((long)uVar5 < 0) {
                data_00.data = data_00.data &
                               ((long)*(char *)((long)ptr + 7) << 0x2a | 0x3ffffffffffU);
                if ((long)data_00 < 0) {
                  uVar5 = uVar5 & ((long)(char)*(ushort *)((long)ptr + 8) << 0x31 | 0x1ffffffffffffU
                                  );
                  if ((long)uVar5 < 0) {
                    uVar7 = (ulong)*(byte *)((long)ptr + 9) << 0x38 | 0xffffffffffffff;
                    data_00.data = data_00.data & uVar7;
                    if ((long)data_00 < 0) {
                      puVar9 = (ushort *)((long)ptr + 0xb);
                      bVar2 = (byte)*(ushort *)((long)ptr + 10);
                      if (bVar2 != 1) {
                        if ((char)bVar2 < '\0') {
                          pcVar8 = Error(msg,pcVar8,
                                         (ParseContext *)CONCAT71((int7)(uVar7 >> 8),bVar2),
                                         (TcFieldData)data_00,table,hasbits);
                          return pcVar8;
                        }
                        if ((bVar2 & 1) == 0) {
                          data_00.data = data_00.data ^ 0x8000000000000000;
                        }
                      }
                    }
                    else {
                      puVar9 = (ushort *)((long)ptr + 10);
                    }
                  }
                  else {
                    puVar9 = (ushort *)((long)ptr + 9);
                  }
                }
                else {
                  puVar9 = (ushort *)((long)ptr + 8);
                }
              }
              else {
                puVar9 = (ushort *)((long)ptr + 7);
              }
            }
            else {
              puVar9 = (ushort *)((long)ptr + 6);
            }
          }
          else {
            puVar9 = (ushort *)((long)ptr + 5);
          }
        }
        else {
          puVar9 = (ushort *)((long)ptr + 4);
        }
        uVar5 = uVar5 & data_00.data;
      }
      else {
        puVar9 = (ushort *)((long)ptr + 3);
      }
      pcVar8 = (char *)((ulong)pcVar8 & uVar5);
    }
    else {
      puVar9 = (ushort *)((long)ptr + 2);
    }
    value = (int)pcVar8;
    if ((value < (int)uVar3) || ((int)((ulong)uVar3 >> 0x20) < value)) {
      pcVar8 = FastUnknownEnumFallback(msg,ptr,ctx,(TcFieldData)data_00,table,hasbits);
      return pcVar8;
    }
    RepeatedField<int>::Add(this,value);
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= puVar9) {
      if ((ulong)table->has_bits_offset != 0) {
        puVar6 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
        *puVar6 = *puVar6 | (uint)hasbits;
      }
      return (char *)puVar9;
    }
    ptr = (char *)puVar9;
  } while ((char)*puVar9 == cVar1);
  uVar4 = (uint)table->fast_idx_mask & (uint)*puVar9;
  if ((uVar4 & 7) == 0) {
    uVar5 = (ulong)(uVar4 & 0xfffffff8);
    pcVar8 = (char *)(**(code **)(&table[1].has_bits_offset + uVar5))
                               (msg,puVar9,ctx,
                                (ulong)*puVar9 ^ *(ulong *)(&table[1].fast_idx_mask + uVar5 * 2),
                                table,hasbits);
    return pcVar8;
  }
  protobuf_assumption_failed
            ("(idx & 7) == 0",
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
             ,0x452);
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastErR1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedEnum<uint8_t, field_layout::kTvRange>(
      PROTOBUF_TC_PARAM_PASS);
}